

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetProcAddressTests.cpp
# Opt level: O0

int __thiscall deqp::egl::GetProcAddressTests::init(GetProcAddressTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *eglTestCtx;
  ulong uVar1;
  char cVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  ulong uVar4;
  char *pcVar5;
  GetProcAddressExtensionCase *this_00;
  char *description;
  GetProcAddressCoreFunctionsCase *pGVar6;
  TestCaseGroup *coreFuncGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  ulong local_80;
  size_t ndx;
  string testName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string *extName;
  int extNdx;
  TestNode *local_18;
  TestCaseGroup *extensionsGroup;
  GetProcAddressTests *this_local;
  
  extensionsGroup = (TestCaseGroup *)this;
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"extension",
             "Test EGL extensions");
  local_18 = pTVar3;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  for (extName._0_4_ = 0; (int)extName < 0x9d; extName._0_4_ = (int)extName + 1) {
    pcVar5 = *(char **)(egl::(anonymous_namespace)::s_extensions + (long)(int)extName * 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,pcVar5,(allocator<char> *)(testName.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(testName.field_2._M_local_buf + 0xf));
    local_30 = &local_50;
    std::__cxx11::string::string((string *)&ndx,(string *)local_30);
    local_80 = 0;
    while( true ) {
      uVar1 = local_80;
      uVar4 = std::__cxx11::string::length();
      pTVar3 = local_18;
      if (uVar4 <= uVar1) break;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
      cVar2 = de::toLower(*pcVar5);
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&ndx);
      *pcVar5 = cVar2;
      local_80 = local_80 + 1;
    }
    this_00 = (GetProcAddressExtensionCase *)operator_new(0xd0);
    eglTestCtx = (this->super_TestCaseGroup).m_eglTestCtx;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_a0,"Test ",local_30);
    description = (char *)std::__cxx11::string::c_str();
    GetProcAddressExtensionCase::GetProcAddressExtensionCase
              (this_00,eglTestCtx,pcVar5,description,local_30);
    tcu::TestNode::addChild(pTVar3,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&ndx);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"core",
             "Test core functions");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pGVar6 = (GetProcAddressCoreFunctionsCase *)operator_new(0xb8);
  GetProcAddressCoreFunctionsCase::GetProcAddressCoreFunctionsCase
            (pGVar6,(this->super_TestCaseGroup).m_eglTestCtx,"egl","Test EGL core functions",0);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pGVar6);
  pGVar6 = (GetProcAddressCoreFunctionsCase *)operator_new(0xb8);
  GetProcAddressCoreFunctionsCase::GetProcAddressCoreFunctionsCase
            (pGVar6,(this->super_TestCaseGroup).m_eglTestCtx,"gles","Test OpenGL ES core functions",
             1);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pGVar6);
  pGVar6 = (GetProcAddressCoreFunctionsCase *)operator_new(0xb8);
  GetProcAddressCoreFunctionsCase::GetProcAddressCoreFunctionsCase
            (pGVar6,(this->super_TestCaseGroup).m_eglTestCtx,"gles2",
             "Test OpenGL ES 2 core functions",4);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pGVar6);
  pGVar6 = (GetProcAddressCoreFunctionsCase *)operator_new(0xb8);
  GetProcAddressCoreFunctionsCase::GetProcAddressCoreFunctionsCase
            (pGVar6,(this->super_TestCaseGroup).m_eglTestCtx,"gles3",
             "Test OpenGL ES 3 core functions",0x40);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pGVar6);
  return extraout_EAX;
}

Assistant:

void GetProcAddressTests::init (void)
{
	// extensions
	{
		tcu::TestCaseGroup* extensionsGroup = new tcu::TestCaseGroup(m_testCtx, "extension", "Test EGL extensions");
		addChild(extensionsGroup);

		for (int extNdx = 0; extNdx < DE_LENGTH_OF_ARRAY(s_extensions); extNdx++)
		{
			const std::string&		extName		= s_extensions[extNdx].name;
			std::string				testName	(extName);

			for (size_t ndx = 0; ndx < extName.length(); ndx++)
				testName[ndx] = de::toLower(extName[ndx]);

			extensionsGroup->addChild(new GetProcAddressExtensionCase(m_eglTestCtx, testName.c_str(), ("Test " + extName).c_str(), extName));
		}
	}

	// core functions
	{
		tcu::TestCaseGroup* coreFuncGroup = new tcu::TestCaseGroup(m_testCtx, "core", "Test core functions");
		addChild(coreFuncGroup);

		coreFuncGroup->addChild(new GetProcAddressCoreFunctionsCase	(m_eglTestCtx,	"egl",		"Test EGL core functions",			0));
		coreFuncGroup->addChild(new GetProcAddressCoreFunctionsCase	(m_eglTestCtx,	"gles",		"Test OpenGL ES core functions",	EGL_OPENGL_ES_BIT));
		coreFuncGroup->addChild(new GetProcAddressCoreFunctionsCase	(m_eglTestCtx,	"gles2",	"Test OpenGL ES 2 core functions",	EGL_OPENGL_ES2_BIT));
		coreFuncGroup->addChild(new GetProcAddressCoreFunctionsCase	(m_eglTestCtx,	"gles3",	"Test OpenGL ES 3 core functions",	EGL_OPENGL_ES3_BIT_KHR));
	}
}